

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O2

void __thiscall
imrt::EvaluationFunction::EvaluationFunction
          (EvaluationFunction *this,vector<imrt::Volume,_std::allocator<imrt::Volume>_> *volumes,
          Collimator *collimator)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  pointer pVVar3;
  pointer pVVar4;
  const_iterator cVar5;
  size_type __n;
  long lVar6;
  long lVar7;
  allocator_type local_a2;
  allocator_type local_a1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_a0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_98;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> *local_90;
  _Vector_base<double,_std::allocator<double>_> local_88;
  list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  *local_70;
  unordered_map<std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>_>
  *local_68;
  unordered_map<std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  *local_60;
  unordered_map<std::pair<int,_int>,_double,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  *local_58;
  set<std::pair<double,_std::pair<int,_int>_>,_imrt::MagnitudeCompare,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
  *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_40;
  Collimator *local_38;
  
  this->_vptr_EvaluationFunction = (_func_int **)&PTR__EvaluationFunction_00132d28;
  local_98 = &this->Z;
  (this->Z).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Z).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Z).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pVVar3 = (volumes->super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4 = (volumes->super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_88,0x96,&local_a2);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->voxel_dose,(long)pVVar4 - (long)pVVar3 >> 6,(value_type *)&local_88,&local_a1);
  local_40 = &this->voxel_dose;
  local_38 = collimator;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_88);
  this->volumes = volumes;
  __n = (long)(volumes->super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(volumes->super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
              super__Vector_impl_data._M_start >> 6;
  this->nb_organs = (int)__n;
  local_48 = &this->nb_voxels;
  std::vector<int,_std::allocator<int>_>::vector(local_48,__n,(allocator_type *)&local_88);
  (this->voxels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->voxels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->voxels)._M_t._M_impl.super__Rb_tree_header;
  this->F = 0.0;
  this->prev_F = 0.0;
  (this->voxels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->voxels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->voxels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_50 = &this->voxels;
  local_58 = &this->beamlet_impact;
  (this->beamlet_impact)._M_h._M_buckets = &(this->beamlet_impact)._M_h._M_single_bucket;
  (this->beamlet_impact)._M_h._M_bucket_count = 1;
  (this->beamlet_impact)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->beamlet_impact)._M_h._M_element_count = 0;
  (this->beamlet_impact)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->beamlet_impact)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->beamlet_impact)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_60 = &this->voxel2beamlet_list;
  (this->voxel2beamlet_list)._M_h._M_buckets = &(this->voxel2beamlet_list)._M_h._M_single_bucket;
  (this->voxel2beamlet_list)._M_h._M_bucket_count = 1;
  (this->voxel2beamlet_list)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->voxel2beamlet_list)._M_h._M_element_count = 0;
  (this->voxel2beamlet_list)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->voxel2beamlet_list)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->voxel2beamlet_list)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_68 = &this->beamlet2voxel_list;
  (this->beamlet2voxel_list)._M_h._M_buckets = &(this->beamlet2voxel_list)._M_h._M_single_bucket;
  (this->beamlet2voxel_list)._M_h._M_bucket_count = 1;
  (this->beamlet2voxel_list)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->beamlet2voxel_list)._M_h._M_element_count = 0;
  (this->beamlet2voxel_list)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_a0 = &this->D;
  local_70 = &this->Z_diff;
  (this->D).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->D).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->D).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->beamlet2voxel_list)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->beamlet2voxel_list)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->Z_diff).
  super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)local_70;
  (this->Z_diff).
  super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_70;
  (this->Z_diff).
  super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ._M_impl._M_node._M_size = 0;
  this->n_volumes =
       (int)((ulong)((long)(volumes->super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(volumes->super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)
                          ._M_impl.super__Vector_impl_data._M_start) >> 6);
  lVar6 = 0xe;
  local_90 = volumes;
  for (lVar7 = 0; lVar7 < this->nb_organs; lVar7 = lVar7 + 1) {
    iVar2 = *(int *)((long)&((local_90->
                             super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>).
                             _M_impl.super__Vector_impl_data._M_start)->collimator + lVar6 * 4);
    (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar7] = iVar2;
    cVar5._M_current =
         (this->Z).
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_88,(long)iVar2,&local_a2);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::_M_insert_rval(local_98,cVar5,(value_type *)&local_88);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_88);
    cVar5._M_current =
         (this->D).
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_88,
               (long)(this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar7],&local_a2);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::_M_insert_rval(local_a0,cVar5,(value_type *)&local_88);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_88);
    lVar6 = lVar6 + 0x10;
  }
  create_voxel2beamlet_list(this,local_90,local_38);
  return;
}

Assistant:

EvaluationFunction::EvaluationFunction(vector<Volume>& volumes, const Collimator& collimator) : prev_F(0.0), F(0.0),
	volumes(volumes), nb_organs(volumes.size()), nb_voxels(volumes.size()), voxel_dose(volumes.size(), vector<double>(150)) {
  n_volumes =volumes.size();
	for(int i=0; i<nb_organs; i++){
		nb_voxels[i]=volumes[i].getNbVoxels();
		Z.insert(Z.end(), vector<double>(nb_voxels[i]));
		D.insert(D.end(), vector<double>(nb_voxels[i]));
	}

	create_voxel2beamlet_list(volumes, collimator);

}